

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNNNCo.cpp
# Opt level: O0

void __thiscall NaPNNNController::set_nn_unit(NaPNNNController *this,NaNNUnit *pNN)

{
  uint uVar1;
  uint uVar2;
  long in_RSI;
  NaPNDelay *in_RDI;
  uint nLagR;
  uint nLagE;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  NaPNNNUnit *in_stack_ffffffffffffffc0;
  NaPNSkip *this_00;
  NaNeuralNetDescr *in_stack_ffffffffffffffd0;
  NaPetriNet **this_01;
  uint in_stack_ffffffffffffffdc;
  
  NaPNNNUnit::set_nn_unit
            (in_stack_ffffffffffffffc0,
             (NaNNUnit *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  this_00 = (NaPNSkip *)&in_RDI[1].super_NaPetriNode.pNet;
  NaNeuralNetDescr::InputDelays(in_stack_ffffffffffffffd0);
  NaPNDelay::set_delay(in_RDI,in_stack_ffffffffffffffdc,(uint *)in_stack_ffffffffffffffd0);
  this_01 = &in_RDI[2].super_NaPetriNode.pNet;
  uVar1 = *(uint *)(in_RSI + 0x9c);
  NaNeuralNetDescr::OutputDelays((NaNeuralNetDescr *)this_01);
  NaPNDelay::set_delay(in_RDI,uVar1,(uint *)this_01);
  uVar1 = NaPNDelay::get_max_delay((NaPNDelay *)&in_RDI[1].super_NaPetriNode.pNet);
  uVar2 = NaPNDelay::get_max_delay((NaPNDelay *)&in_RDI[2].super_NaPetriNode.pNet);
  if (uVar1 < uVar2) {
    NaPNSkip::set_skip_number(this_00,in_stack_ffffffffffffffbc);
  }
  else {
    NaPNSkip::set_skip_number(this_00,in_stack_ffffffffffffffbc);
  }
  return;
}

Assistant:

void
NaPNNNController::set_nn_unit (NaNNUnit* pNN)
{
    nnunit.set_nn_unit(pNN);

    delay_e.set_delay(pNN->descr.nInputsRepeat, pNN->descr.InputDelays());
    delay_r.set_delay(pNN->descr.nOutputsRepeat, pNN->descr.OutputDelays());

    unsigned nLagE = delay_e.get_max_delay();
    unsigned nLagR = delay_r.get_max_delay();
    if(nLagE < nLagR)
	skip_e.set_skip_number(nLagR - nLagE);
    else
	skip_r.set_skip_number(nLagE - nLagR);
}